

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O1

int Abc_NodeCollapseSuppSize(Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins)

{
  uint uVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  vFanins->nSize = 0;
  if (0 < (pFanout->vFanins).nSize) {
    lVar8 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pFanout->pNtk->vObjs->pArray[(pFanout->vFanins).pArray[lVar8]];
      if (pAVar3 != pFanin) {
        uVar1 = vFanins->nSize;
        if (0 < (long)(int)uVar1) {
          lVar6 = 0;
          do {
            if ((Abc_Obj_t *)vFanins->pArray[lVar6] == pAVar3) goto LAB_001ddf0b;
            lVar6 = lVar6 + 1;
          } while ((int)uVar1 != lVar6);
        }
        uVar2 = vFanins->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vFanins->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vFanins->pArray,0x80);
            }
            vFanins->pArray = ppvVar5;
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar2 * 2;
            if (iVar7 <= (int)uVar2) goto LAB_001ddef9;
            if (vFanins->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(vFanins->pArray,(ulong)uVar2 << 4);
            }
            vFanins->pArray = ppvVar5;
          }
          vFanins->nCap = iVar7;
        }
LAB_001ddef9:
        iVar7 = vFanins->nSize;
        vFanins->nSize = iVar7 + 1;
        vFanins->pArray[iVar7] = pAVar3;
      }
LAB_001ddf0b:
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pFanout->vFanins).nSize);
  }
  if (0 < (pFanin->vFanins).nSize) {
    lVar8 = 0;
    do {
      pvVar4 = pFanin->pNtk->vObjs->pArray[(pFanin->vFanins).pArray[lVar8]];
      uVar1 = vFanins->nSize;
      if (0 < (long)(int)uVar1) {
        lVar6 = 0;
        do {
          if (vFanins->pArray[lVar6] == pvVar4) goto LAB_001ddfdd;
          lVar6 = lVar6 + 1;
        } while ((int)uVar1 != lVar6);
      }
      uVar2 = vFanins->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vFanins->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vFanins->pArray,0x80);
          }
          vFanins->pArray = ppvVar5;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar2 * 2;
          if (iVar7 <= (int)uVar2) goto LAB_001ddfcb;
          if (vFanins->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vFanins->pArray,(ulong)uVar2 << 4);
          }
          vFanins->pArray = ppvVar5;
        }
        vFanins->nCap = iVar7;
      }
LAB_001ddfcb:
      iVar7 = vFanins->nSize;
      vFanins->nSize = iVar7 + 1;
      vFanins->pArray[iVar7] = pvVar4;
LAB_001ddfdd:
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pFanin->vFanins).nSize);
  }
  return vFanins->nSize;
}

Assistant:

int Abc_NodeCollapseSuppSize( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_PtrClear( vFanins );
    Abc_ObjForEachFanin( pFanout, pObj, i )
        if ( pObj != pFanin )
            Vec_PtrPushUnique( vFanins, pObj );
    Abc_ObjForEachFanin( pFanin, pObj, i )
        Vec_PtrPushUnique( vFanins, pObj );
    return Vec_PtrSize( vFanins );
}